

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::BufferIoExecutor::initBuffers(BufferIoExecutor *this,int numValues)

{
  deUint32 dVar1;
  deUint32 dVar2;
  int outputBufferSize;
  int inputBufferSize;
  deUint32 outputStride;
  deUint32 inputStride;
  int numValues_local;
  BufferIoExecutor *this_local;
  
  dVar1 = getLayoutStride(&this->m_inputLayout);
  dVar2 = getLayoutStride(&this->m_outputLayout);
  resizeInputBuffer(this,numValues * dVar1);
  resizeOutputBuffer(this,numValues * dVar2);
  return;
}

Assistant:

void BufferIoExecutor::initBuffers (int numValues)
{
	const deUint32		inputStride			= getLayoutStride(m_inputLayout);
	const deUint32		outputStride		= getLayoutStride(m_outputLayout);
	const int			inputBufferSize		= numValues * inputStride;
	const int			outputBufferSize	= numValues * outputStride;

	resizeInputBuffer(inputBufferSize);
	resizeOutputBuffer(outputBufferSize);
}